

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SettingsUI.cpp
# Opt level: O0

bool LTSettingsUI::ToggleDisplay(int _force)

{
  bool bVar1;
  LTSettingsUI *pLVar2;
  int in_EDI;
  LTSettingsUI *in_stack_00000190;
  int local_8;
  bool local_1;
  
  local_8 = in_EDI;
  if (in_EDI == 0) {
    bVar1 = IsDisplayed();
    local_8 = 1;
    if (bVar1) {
      local_8 = -1;
    }
  }
  if (local_8 < 1) {
    if ((gpSettings != (LTSettingsUI *)0x0) && (gpSettings != (LTSettingsUI *)0x0)) {
      (*(gpSettings->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[1])();
    }
    local_1 = false;
  }
  else {
    if (gpSettings == (LTSettingsUI *)0x0) {
      pLVar2 = (LTSettingsUI *)operator_new(0x618);
      LTSettingsUI(in_stack_00000190);
      gpSettings = pLVar2;
    }
    (*(gpSettings->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[2])(gpSettings,1);
    ImgWindow::BringWindowToFront((ImgWindow *)0x27ab22);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool LTSettingsUI::ToggleDisplay (int _force)
{
    // If we toggle then do what current is not the state
    if (!_force)
        _force = LTSettingsUI::IsDisplayed() ? -1 : 1;
    
    // Open the window?
    if (_force > 0)
    {
        // Create the object and window if needed
        if (!gpSettings)
            gpSettings = new LTSettingsUI();
        // Ensure it is visible and centered
        gpSettings->SetVisible(true);
        gpSettings->BringWindowToFront();
        return true;                    // visible now
    }
    // Close the window
    else
    {
        if (gpSettings)                 // just remove the object
            delete gpSettings;          // (constructor clears gpSettings)
        return false;                   // not visible
    }
}